

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_dummy.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::SetRegistrarHostname
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aHostname)

{
  string *aHostname_local;
  CommissionerApp *this_local;
  
  Error::Error(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetRegistrarHostname(const std::string &aHostname)
{
    UNUSED(aHostname);
    return Error{};
}